

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

optional<DevFmtChannels> __thiscall
anon_unknown.dwarf_7e3ca::DevFmtChannelsFromEnum(anon_unknown_dwarf_7e3ca *this,ALCenum channels)

{
  switch(channels) {
  case 0x1500:
    *(undefined2 *)this = 1;
    break;
  case 0x1501:
    *(undefined2 *)this = 0x101;
    break;
  default:
    if (1 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported format channels: 0x%04x\n");
    }
    *(undefined2 *)this = 0;
    break;
  case 0x1503:
    *(undefined2 *)this = 0x201;
    break;
  case 0x1504:
    *(undefined2 *)this = 0x301;
    break;
  case 0x1505:
    *(undefined2 *)this = 0x401;
    break;
  case 0x1506:
    *(undefined2 *)this = 0x501;
    break;
  case 0x1507:
    *(undefined2 *)this = 0x601;
  }
  return SUB82(this,0);
}

Assistant:

al::optional<DevFmtChannels> DevFmtChannelsFromEnum(ALCenum channels)
{
    switch(channels)
    {
    case ALC_MONO_SOFT: return al::make_optional(DevFmtMono);
    case ALC_STEREO_SOFT: return al::make_optional(DevFmtStereo);
    case ALC_QUAD_SOFT: return al::make_optional(DevFmtQuad);
    case ALC_5POINT1_SOFT: return al::make_optional(DevFmtX51);
    case ALC_6POINT1_SOFT: return al::make_optional(DevFmtX61);
    case ALC_7POINT1_SOFT: return al::make_optional(DevFmtX71);
    case ALC_BFORMAT3D_SOFT: return al::make_optional(DevFmtAmbi3D);
    }
    WARN("Unsupported format channels: 0x%04x\n", channels);
    return al::nullopt;
}